

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

UBool __thiscall
icu_63::UVector::ensureCapacity(UVector *this,int32_t minimumCapacity,UErrorCode *status)

{
  UElement *pUVar1;
  UElement *newElems;
  int32_t newCap;
  UErrorCode *status_local;
  int32_t minimumCapacity_local;
  UVector *this_local;
  
  if (minimumCapacity < 0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return '\0';
  }
  if (this->capacity < minimumCapacity) {
    if (0x3fffffff < this->capacity) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return '\0';
    }
    newElems._4_4_ = this->capacity << 1;
    if (newElems._4_4_ < minimumCapacity) {
      newElems._4_4_ = minimumCapacity;
    }
    if (0xfffffff < newElems._4_4_) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return '\0';
    }
    pUVar1 = (UElement *)uprv_realloc_63(this->elements,(long)newElems._4_4_ << 3);
    if (pUVar1 == (UElement *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return '\0';
    }
    this->elements = pUVar1;
    this->capacity = newElems._4_4_;
  }
  return '\x01';
}

Assistant:

UBool UVector::ensureCapacity(int32_t minimumCapacity, UErrorCode &status) {
	if (minimumCapacity < 0) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return FALSE;
	}
    if (capacity < minimumCapacity) {
        if (capacity > (INT32_MAX - 1) / 2) {        	// integer overflow check
        	status = U_ILLEGAL_ARGUMENT_ERROR;
        	return FALSE;
        }
        int32_t newCap = capacity * 2;
        if (newCap < minimumCapacity) {
            newCap = minimumCapacity;
        }
        if (newCap > (int32_t)(INT32_MAX / sizeof(UElement))) {	// integer overflow check
        	// We keep the original memory contents on bad minimumCapacity.
        	status = U_ILLEGAL_ARGUMENT_ERROR;
        	return FALSE;
        }
        UElement* newElems = (UElement *)uprv_realloc(elements, sizeof(UElement)*newCap);
        if (newElems == NULL) {
            // We keep the original contents on the memory failure on realloc or bad minimumCapacity.
            status = U_MEMORY_ALLOCATION_ERROR;
            return FALSE;
        }
        elements = newElems;
        capacity = newCap;
    }
    return TRUE;
}